

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O3

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 __thiscall
duckdb::ArrowTableFunction::ArrowScanInitLocalInternal
          (ArrowTableFunction *this,ClientContext *context,TableFunctionInitInput *input,
          GlobalTableFunctionState *global_state_p)

{
  TableFilterSet *pTVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false> _Var3;
  bool bVar4;
  element_type *peVar5;
  _Tuple_impl<0UL,_duckdb::ArrowScanLocalState_*,_std::default_delete<duckdb::ArrowScanLocalState>_>
  this_00;
  pointer pAVar6;
  type state;
  pointer *__ptr;
  ClientContext *__x;
  ClientContext *context_00;
  ArrowScanGlobalState *asgs;
  _Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false> local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false> local_38;
  
  context_00 = (ClientContext *)&stack0xffffffffffffffb8;
  peVar5 = (element_type *)operator_new(0x50);
  ((ArrowArray *)&peVar5->super_enable_shared_from_this<duckdb::DatabaseInstance>)->length = 0;
  (peVar5->config).replacement_scans.
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  this_00.super__Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>)operator_new(200);
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_head_impl = (ArrowArrayWrapper *)peVar5;
  ArrowScanLocalState::ArrowScanLocalState
            ((ArrowScanLocalState *)
             this_00.super__Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>._M_head_impl,
             (unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
              *)&stack0xffffffffffffffc8,context);
  _Var3._M_head_impl = local_38._M_head_impl;
  local_48._M_head_impl =
       (ArrowScanLocalState *)
       this_00.super__Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>._M_head_impl;
  if ((_Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false>)local_38._M_head_impl !=
      (_Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false>)0x0) {
    ArrowArrayWrapper::~ArrowArrayWrapper(local_38._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                         *)&stack0xffffffffffffffb8);
  __x = (ClientContext *)&input->column_ids;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pAVar6->column_ids,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
  pTVar1 = (input->filters).ptr;
  pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                         *)&stack0xffffffffffffffb8);
  pAVar6->filters = pTVar1;
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  if (*(char *)&(input->bind_data).ptr[0x1d]._vptr_FunctionData == '\0') {
    pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                           *)&stack0xffffffffffffffb8);
    puVar2 = (pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
  }
  else if ((input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                           *)&stack0xffffffffffffffb8);
    DataChunk::Initialize
              (&pAVar6->all_columns,context,
               (vector<duckdb::LogicalType,_true> *)(global_state_p + 0xd),0x800);
    __x = context;
  }
  state = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
          ::operator*((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                       *)&stack0xffffffffffffffb8);
  bVar4 = ArrowScanParallelStateNext
                    (context_00,(FunctionData *)__x,state,(ArrowScanGlobalState *)global_state_p);
  if (bVar4) {
    *(ArrowScanLocalState **)this = local_48._M_head_impl;
  }
  else {
    *(undefined8 *)this = 0;
    if (local_48._M_head_impl != (ArrowScanLocalState *)0x0) {
      (*((local_48._M_head_impl)->super_LocalTableFunctionState)._vptr_LocalTableFunctionState[1])()
      ;
    }
  }
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<LocalTableFunctionState>
ArrowTableFunction::ArrowScanInitLocalInternal(ClientContext &context, TableFunctionInitInput &input,
                                               GlobalTableFunctionState *global_state_p) {
	auto &global_state = global_state_p->Cast<ArrowScanGlobalState>();
	auto current_chunk = make_uniq<ArrowArrayWrapper>();
	auto result = make_uniq<ArrowScanLocalState>(std::move(current_chunk), context);
	result->column_ids = input.column_ids;
	result->filters = input.filters.get();
	auto &bind_data = input.bind_data->Cast<ArrowScanFunctionData>();
	if (!bind_data.projection_pushdown_enabled) {
		result->column_ids.clear();
	} else if (!input.projection_ids.empty()) {
		auto &asgs = global_state_p->Cast<ArrowScanGlobalState>();
		result->all_columns.Initialize(context, asgs.scanned_types);
	}
	if (!ArrowScanParallelStateNext(context, input.bind_data.get(), *result, global_state)) {
		return nullptr;
	}
	return std::move(result);
}